

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exp.cpp
# Opt level: O2

void Exp::genDBData(double fraction)

{
  size_type sVar1;
  undefined8 uVar2;
  pointer ppVar3;
  istream *piVar4;
  long lVar5;
  ostream *poVar6;
  BadBoy *this;
  ulong uVar7;
  ulong uVar8;
  PolynomialJoiner *this_00;
  long lVar9;
  string *psVar10;
  string *psVar11;
  int iVar12;
  int iVar13;
  pointer ppVar14;
  int x;
  long *plVar15;
  __node_base *p_Var16;
  undefined1 auVar17 [16];
  double dVar18;
  string sigstr_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_sigs;
  string cur_lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cells;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cells_full;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  rules;
  string cur_rhs;
  string file;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  app_rules;
  string cell;
  string files [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a60;
  timeval t1;
  ofstream fout4;
  long local_a28 [62];
  ofstream fout1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828 [31];
  ofstream fout3;
  ofstream fout2;
  ifstream fin;
  
  std::__cxx11::string::string((string *)files,"area",(allocator *)&fin);
  for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 0x20) {
    std::__cxx11::string::string
              ((string *)&file,(string *)((long)&files[0]._M_dataplus._M_p + lVar9));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,
                   "data/",&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,
                   "_names/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout3,&file
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout2,
                   "_names.txt");
    std::ifstream::ifstream(&fin,(string *)&fout1,_S_in);
    std::__cxx11::string::~string((string *)&fout1);
    std::__cxx11::string::~string((string *)&fout2);
    std::__cxx11::string::~string((string *)&fout3);
    std::__cxx11::string::~string((string *)&fout4);
    cells_full.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cells.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cell._M_dataplus._M_p = (pointer)&cell.field_2;
    cell._M_string_length = 0;
    cells_full.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cells_full.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cells.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cells.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cell.field_2._M_local_buf[0] = '\0';
    _fout1 = (pointer)local_828;
    local_828[0]._M_local_buf[0] = '\0';
    while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&fin,(string *)&fout1),
          ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&cells_full,(value_type *)&fout1);
    }
    std::__cxx11::string::~string((string *)&fout1);
    std::ifstream::close();
    lVar5 = (long)cells_full.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)cells_full.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    auVar17._8_4_ =
         (int)((long)cells_full.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)cells_full.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 0x25);
    auVar17._0_8_ = lVar5;
    auVar17._12_4_ = 0x45300000;
    dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * fraction;
    lVar5 = 0;
    for (iVar12 = 0; (double)iVar12 < dVar18; iVar12 = iVar12 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&cells,(value_type *)
                         ((long)&((cells_full.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar5));
      lVar5 = lVar5 + 0x20;
    }
    gettimeofday((timeval *)&t1,(__timezone_ptr_t)0x0);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Generating rules......");
    std::endl<char,std::char_traits<char>>(poVar6);
    this = (BadBoy *)operator_new(0x90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a60,&cells);
    BadBoy::BadBoy(this,&local_a60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a60);
    (**(this->super_RuleGenerator)._vptr_RuleGenerator)(&rules,this);
    uVar7 = ((long)rules.
                   super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)rules.
                  super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
    }
    for (lVar5 = 0; uVar8 * 0x30 - lVar5 != 0; lVar5 = lVar5 + 0x30) {
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
                ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&fout1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&((rules.
                              super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->second).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar5),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&((rules.
                              super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar5));
      std::
      vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
      ::
      emplace_back<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  *)&rules,
                 (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&fout1);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&fout1);
    }
    Common::JAC_THRESHOLD = 0.7;
    this_00 = (PolynomialJoiner *)operator_new(0x1f0);
    std::
    vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::vector(&local_ab0,&rules);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a78,&cells);
    PolynomialJoiner::PolynomialJoiner(this_00,&local_ab0,&local_a78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a78);
    std::
    vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&local_ab0);
    std::__cxx11::to_string((string *)&t_sigs,fraction);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,
                   "exp/db/",(string *)&t_sigs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,&file
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout3,
                   "_name.txt");
    std::ofstream::ofstream(&fout1,(string *)&fout2,_S_out);
    std::__cxx11::string::~string((string *)&fout2);
    std::__cxx11::string::~string((string *)&fout3);
    std::__cxx11::string::~string((string *)&fout4);
    std::__cxx11::string::~string((string *)&t_sigs);
    lVar5 = 0;
    for (iVar12 = 0; (double)iVar12 < dVar18; iVar12 = iVar12 + 1) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fout1,iVar12);
      poVar6 = std::operator<<(poVar6,'\t');
      poVar6 = std::operator<<(poVar6,(string *)
                                      ((long)&((cells.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar5));
      std::endl<char,std::char_traits<char>>(poVar6);
      lVar5 = lVar5 + 0x20;
    }
    std::ofstream::close();
    std::__cxx11::to_string(&sigstr_1,fraction);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_sigs,
                   "exp/db/",&sigstr_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_sigs,
                   &file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,
                   "_osig.txt");
    std::ofstream::ofstream(&fout2,(string *)&fout3,_S_out);
    std::__cxx11::string::~string((string *)&fout3);
    std::__cxx11::string::~string((string *)&fout4);
    std::__cxx11::string::~string((string *)&t_sigs);
    std::__cxx11::string::~string((string *)&sigstr_1);
    std::__cxx11::to_string(&cur_lhs,fraction);
    std::operator+(&sigstr_1,"exp/db/",&cur_lhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_sigs,
                   &sigstr_1,&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_sigs,
                   "_tsig.txt");
    std::ofstream::ofstream(&fout3,(string *)&fout4,_S_out);
    std::__cxx11::string::~string((string *)&fout4);
    std::__cxx11::string::~string((string *)&t_sigs);
    std::__cxx11::string::~string((string *)&sigstr_1);
    std::__cxx11::string::~string((string *)&cur_lhs);
    iVar13 = 0;
    iVar12 = 0;
    for (x = 0; (double)x < dVar18; x = x + 1) {
      Joiner::get_o_sigs_abi_cxx11_
                ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fout4,(Joiner *)this_00,x);
      plVar15 = local_a28;
      while (plVar15 = (long *)*plVar15, plVar15 != (long *)0x0) {
        std::__cxx11::string::string((string *)&t_sigs,(string *)(plVar15 + 1));
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fout2,iVar13);
        poVar6 = std::operator<<(poVar6,'\t');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,x);
        poVar6 = std::operator<<(poVar6,'\t');
        poVar6 = std::operator<<(poVar6,(string *)&t_sigs);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&t_sigs);
        iVar13 = iVar13 + 1;
      }
      PolynomialJoiner::get_t_sigs_abi_cxx11_(&t_sigs,this_00,x);
      p_Var16 = &t_sigs._M_h._M_before_begin;
      while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
        std::__cxx11::string::string((string *)&sigstr_1,(string *)(p_Var16 + 1));
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fout3,iVar12);
        poVar6 = std::operator<<(poVar6,'\t');
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,x);
        poVar6 = std::operator<<(poVar6,'\t');
        poVar6 = std::operator<<(poVar6,(string *)&sigstr_1);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&sigstr_1);
        iVar12 = iVar12 + 1;
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&t_sigs._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&fout4);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::__cxx11::to_string(&cur_rhs,fraction);
    std::operator+(&cur_lhs,"exp/db/",&cur_rhs);
    std::operator+(&sigstr_1,&cur_lhs,&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_sigs,
                   &sigstr_1,"_apprule.txt");
    std::ofstream::ofstream(&fout4,(string *)&t_sigs,_S_out);
    std::__cxx11::string::~string((string *)&t_sigs);
    std::__cxx11::string::~string((string *)&sigstr_1);
    std::__cxx11::string::~string((string *)&cur_lhs);
    std::__cxx11::string::~string((string *)&cur_rhs);
    for (iVar12 = 0; (double)iVar12 < dVar18; iVar12 = iVar12 + 1) {
      Joiner::get_applicable_rules_abi_cxx11_(&app_rules,(Joiner *)this_00,iVar12);
      std::__cxx11::string::string((string *)&sigstr_1,"",(allocator *)&t_sigs);
      ppVar3 = app_rules.
               super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar14 = app_rules.
                     super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar3;
          ppVar14 = ppVar14 + 1) {
        std::
        pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&t_sigs,ppVar14);
        std::__cxx11::string::string((string *)&cur_lhs,"",(allocator *)&cur_rhs);
        std::__cxx11::string::string((string *)&cur_rhs,"",(allocator *)&t);
        sVar1 = t_sigs._M_h._M_bucket_count;
        for (psVar10 = (string *)t_sigs._M_h._M_buckets; uVar2 = t_sigs._M_h._M_rehash_policy._0_8_,
            psVar11 = (string *)t_sigs._M_h._M_element_count, psVar10 != (string *)sVar1;
            psVar10 = psVar10 + 0x20) {
          std::__cxx11::string::string((string *)&t,psVar10);
          std::operator+(&local_af0,&t," ");
          std::__cxx11::string::append((string *)&cur_lhs);
          std::__cxx11::string::~string((string *)&local_af0);
          std::__cxx11::string::~string((string *)&t);
        }
        for (; psVar11 != (string *)uVar2; psVar11 = psVar11 + 0x20) {
          std::__cxx11::string::string((string *)&t,psVar11);
          std::operator+(&local_af0,&t," ");
          std::__cxx11::string::append((string *)&cur_rhs);
          std::__cxx11::string::~string((string *)&local_af0);
          std::__cxx11::string::~string((string *)&t);
        }
        std::operator+(&local_a98,&cur_lhs,"|");
        std::operator+(&local_af0,&local_a98,&cur_rhs);
        std::operator+(&t,&local_af0,"**");
        std::__cxx11::string::append((string *)&sigstr_1);
        std::__cxx11::string::~string((string *)&t);
        std::__cxx11::string::~string((string *)&local_af0);
        std::__cxx11::string::~string((string *)&local_a98);
        std::__cxx11::string::~string((string *)&cur_rhs);
        std::__cxx11::string::~string((string *)&cur_lhs);
        std::
        pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&t_sigs);
      }
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fout4,iVar12);
      poVar6 = std::operator<<(poVar6,'\t');
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar12);
      poVar6 = std::operator<<(poVar6,'\t');
      poVar6 = std::operator<<(poVar6,(string *)&sigstr_1);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&sigstr_1);
      std::
      vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~vector(&app_rules);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&fout4);
    std::ofstream::~ofstream(&fout3);
    std::ofstream::~ofstream(&fout2);
    std::ofstream::~ofstream(&fout1);
    std::
    vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&rules);
    std::__cxx11::string::~string((string *)&cell);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cells);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cells_full);
    std::ifstream::~ifstream(&fin);
    std::__cxx11::string::~string((string *)&file);
  }
  std::__cxx11::string::~string((string *)files);
  return;
}

Assistant:

void Exp::genDBData(double fraction)
{
	string files[] = {"area"};
	for (string file : files)
	{
		ifstream fin("data/" + file + "_names/" + file + "_names.txt");
		vector<string> cells_full, cells;
		string cell;
		for (string cell; getline(fin, cell); )
			cells_full.push_back(cell);
		fin.close();
		auto n = cells_full.size() * fraction;
		for (auto i = 0; i < n; i ++)
			cells.push_back(cells_full[i]);

		//generate rules
		struct timeval t1, t2;
		gettimeofday(&t1, NULL);
		cerr << "Generating rules......" << endl;
		RuleGenerator *ruleGenerator;
		ruleGenerator = new BadBoy(cells);
		vector<t_rule> rules = ruleGenerator->gen_rules();
		for (int i = 0, m = (int) rules.size(); i < m; i ++)
			rules.emplace_back(make_pair(rules[i].second, rules[i].first));

		//construct the joiner
		Common::JAC_THRESHOLD = 0.7;
		PolynomialJoiner *joiner = new PolynomialJoiner(rules, cells);

		//generate text file for name table
		ofstream fout1("exp/db/" + to_string(fraction) + file + "_name.txt");
		for (auto i = 0; i < n; i ++)
			fout1 << i << '\t' << cells[i] << endl;
		fout1.close();

		//generate text file for signature tables
		ofstream fout2("exp/db/" + to_string(fraction) + file + "_osig.txt");
		ofstream fout3("exp/db/" + to_string(fraction) + file + "_tsig.txt");
		int osig_id = 0;
		int tsig_id = 0;
		for (auto i = 0; i < n; i ++)
		{
			//osig
			unordered_set<string> o_sigs = joiner->get_o_sigs(i);
			for (string sigstr : o_sigs)
				fout2 << osig_id ++ << '\t' << i << '\t' << sigstr << endl;
			//tsig
			unordered_set<string> t_sigs = joiner->get_t_sigs(i);
			for (string sigstr : t_sigs)
				fout3 << tsig_id ++ << '\t' << i << '\t' << sigstr << endl;
		}
		fout2.close();
		fout3.close();

		//generate tex file for app_rule table
		ofstream fout4("exp/db/" + to_string(fraction) + file + "_apprule.txt");
		for (auto i = 0; i < n; i ++)
		{
			vector<t_rule> app_rules = joiner->get_applicable_rules(i);
			string app_rule_str = "";
			for (t_rule rule : app_rules)
			{
				string cur_lhs = "", cur_rhs = "";
				for (auto t : rule.first)
					cur_lhs += t + " ";
				for (auto t : rule.second)
					cur_rhs += t + " ";
				app_rule_str += cur_lhs + "|" + cur_rhs + "**";
			}
			fout4 << i << '\t' << i << '\t' << app_rule_str << endl;
		}
		fout4.close();
	}
}